

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::remove_children(Tree *this,size_t node)

{
  pfn_error p_Var1;
  size_t sVar2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  bool bVar6;
  NodeData *pNVar7;
  size_t node_00;
  csubstr cVar8;
  char msg [37];
  char *pcStack_68;
  size_t local_60;
  char *pcStack_40;
  size_t local_38;
  
  pNVar7 = get(this,node);
  if (pNVar7 == (NodeData *)0x0) {
    builtin_strncpy(msg,"check failed: (get(node) != nullptr)",0x25);
    if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar8 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_38 = cVar8.len;
    pcStack_40 = cVar8.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x657b) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x657b) << 0x40,8);
    LVar4.name.str = pcStack_40;
    LVar4.name.len = local_38;
    (*p_Var1)(msg,0x25,LVar4,(this->m_callbacks).m_user_data);
  }
  pNVar7 = get(this,node);
  node_00 = pNVar7->m_first_child;
  do {
    if (node_00 == 0xffffffffffffffff) {
      return;
    }
    remove_children(this,node_00);
    pNVar7 = get(this,node_00);
    if (pNVar7 == (NodeData *)0x0) {
      builtin_strncpy(msg,"check failed: (get(ich) != nullptr)",0x24);
      if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      p_Var1 = (this->m_callbacks).m_error;
      cVar8 = to_csubstr(
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                        );
      local_60 = cVar8.len;
      pcStack_68 = cVar8.str;
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x6580) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x6580) << 0x40,8);
      LVar5.name.str = pcStack_68;
      LVar5.name.len = local_60;
      (*p_Var1)(msg,0x24,LVar5,(this->m_callbacks).m_user_data);
    }
    pNVar7 = get(this,node_00);
    sVar2 = pNVar7->m_next_sibling;
    _release(this,node_00);
    pNVar7 = get(this,node);
    bVar6 = node_00 == pNVar7->m_last_child;
    node_00 = sVar2;
    if (bVar6) {
      return;
    }
  } while( true );
}

Assistant:

void Tree::remove_children(size_t node)
{
    _RYML_CB_ASSERT(m_callbacks, get(node) != nullptr);
    size_t ich = get(node)->m_first_child;
    while(ich != NONE)
    {
        remove_children(ich);
        _RYML_CB_ASSERT(m_callbacks, get(ich) != nullptr);
        size_t next = get(ich)->m_next_sibling;
        _release(ich);
        if(ich == get(node)->m_last_child)
            break;
        ich = next;
    }
}